

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::SerializeGroupTo<google::protobuf::internal::ArrayOutput>
          (internal *this,MessageLite *msg,void *table_ptr,ArrayOutput *output)

{
  SerializationTable *table;
  
  if (msg != (MessageLite *)0x0) {
    SerializeMessageDispatch
              ((MessageLite *)this,(FieldMetadata *)(msg[1]._vptr_MessageLite + 3),
               *(int *)&msg->_vptr_MessageLite + -1,(int32)output,(ArrayOutput *)table_ptr);
    return;
  }
  SerializeMessageNoTable((MessageLite *)this,(ArrayOutput *)table_ptr);
  return;
}

Assistant:

void SerializeGroupTo(const MessageLite* msg, const void* table_ptr,
                      O* output) {
  const SerializationTable* table =
      static_cast<const SerializationTable*>(table_ptr);
  if (!table) {
    // Proto1
    SerializeMessageNoTable(msg, output);
    return;
  }
  const FieldMetadata* field_table = table->field_table;
  const uint8* base = reinterpret_cast<const uint8*>(msg);
  int cached_size = *reinterpret_cast<const int32*>(base + field_table->offset);
  int num_fields = table->num_fields - 1;
  SerializeMessageDispatch(*msg, field_table + 1, num_fields, cached_size,
                           output);
}